

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rct.cpp
# Opt level: O0

String * Rct::backtrace(String *__return_storage_ptr__,int maxFrames)

{
  int iVar1;
  char *__ptr;
  char *local_2480;
  bool local_245a;
  char *demangled;
  char local_2428 [4];
  int i;
  char frame [1024];
  char **symbols;
  undefined1 local_2018 [4];
  int frameCount;
  void *stack [1024];
  int maxFrames_local;
  String *ret;
  
  stack[0x3ff]._4_4_ = maxFrames;
  iVar1 = ::backtrace(local_2018,0x400);
  if (iVar1 < 1) {
    String::String(__return_storage_ptr__,"Couldn\'t get stack trace",0xffffffffffffffff);
  }
  else {
    String::String(__return_storage_ptr__,(char *)0x0,0xffffffffffffffff);
    frame._1016_8_ = backtrace_symbols(local_2018,iVar1);
    if (frame._1016_8_ != 0) {
      demangled._4_4_ = 1;
      while( true ) {
        local_245a = false;
        if ((int)demangled._4_4_ < iVar1) {
          local_245a = stack[0x3ff]._4_4_ < 0 || (int)(demangled._4_4_ - 1) < stack[0x3ff]._4_4_;
        }
        if (!local_245a) break;
        __ptr = demangle(*(char **)(frame._1016_8_ + (long)(int)demangled._4_4_ * 8));
        local_2480 = __ptr;
        if (__ptr == (char *)0x0) {
          local_2480 = *(char **)(frame._1016_8_ + (long)(int)demangled._4_4_ * 8);
        }
        snprintf(local_2428,0x400,"%d/%d %s\n",(ulong)demangled._4_4_,(ulong)(iVar1 - 1),local_2480)
        ;
        String::operator+=(__return_storage_ptr__,local_2428);
        if (__ptr != (char *)0x0) {
          free(__ptr);
        }
        demangled._4_4_ = demangled._4_4_ + 1;
      }
      free((void *)frame._1016_8_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String backtrace(int maxFrames)
{
    enum { SIZE = 1024 };
    void *stack[SIZE];

    const int frameCount = backtrace(stack, sizeof(stack) / sizeof(void*));
    if (frameCount <= 0)
        return String("Couldn't get stack trace");
    String ret;
    char **symbols = backtrace_symbols(stack, frameCount);
    if (symbols) {
        char frame[1024];
        for (int i=1; i<frameCount && (maxFrames < 0 || i - 1 < maxFrames); ++i) {
            char *demangled = demangle(symbols[i]);
            snprintf(frame, sizeof(frame), "%d/%d %s\n", i, frameCount - 1, demangled ? demangled : symbols[i]);
            ret += frame;
            if (demangled)
                free(demangled);
        }
        free(symbols);
    }
    return ret;
}